

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmInfo.cpp
# Opt level: O1

GMM_STATUS __thiscall
GmmLib::GmmMultiAdapterContext::RemoveContext(GmmMultiAdapterContext *this,ADAPTER_BDF sBdf)

{
  int iVar1;
  Context *pCVar2;
  int iVar3;
  int32_t *Ref;
  GMM_STATUS GVar4;
  GMM_ADAPTER_INFO *pNode;
  bool bVar5;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->MAContextSyncMutex);
  for (pNode = this->pHeadNode; pNode != (GMM_ADAPTER_INFO *)0x0; pNode = pNode->pNext) {
    if ((((pNode->pGmmLibContext->sBdf).field_0.Data ^ (uint)sBdf.field_0) & 0xffffff) == 0)
    goto LAB_001bc734;
  }
  pNode = (GMM_ADAPTER_INFO *)0x0;
LAB_001bc734:
  if (pNode == (GMM_ADAPTER_INFO *)0x0) {
    GVar4 = GMM_ERROR;
  }
  else {
    pCVar2 = pNode->pGmmLibContext;
    if (pCVar2 != (Context *)0x0) {
      iVar3 = pCVar2->RefCount;
      if (0 < iVar3) {
        do {
          iVar1 = iVar3 + -1;
          LOCK();
          bVar5 = iVar3 == pCVar2->RefCount;
          if (bVar5) {
            pCVar2->RefCount = iVar1;
          }
          UNLOCK();
        } while ((!bVar5) && (iVar3 = pCVar2->RefCount, 0 < iVar3));
        GVar4 = GMM_SUCCESS;
        if (iVar1 != 0) goto LAB_001bc798;
      }
      Context::DestroyContext(pNode->pGmmLibContext);
      pCVar2 = pNode->pGmmLibContext;
      if (pCVar2 != (Context *)0x0) {
        pthread_mutex_destroy((pthread_mutex_t *)&pCVar2->SyncMutex);
        free(pCVar2);
      }
    }
    RemoveAdapterNode(this,pNode);
    GVar4 = GMM_SUCCESS;
  }
LAB_001bc798:
  pthread_mutex_unlock((pthread_mutex_t *)&this->MAContextSyncMutex);
  return GVar4;
}

Assistant:

GMM_STATUS GMM_STDCALL GmmLib::GmmMultiAdapterContext::RemoveContext(ADAPTER_BDF sBdf)
{
    GMM_STATUS SyncLockStatus = LockMAContextSyncMutex();

    if (SyncLockStatus != GMM_SUCCESS)
    {
        return SyncLockStatus;
    }

    GmmLib::GMM_ADAPTER_INFO *pNode = GetAdapterNodeUnlocked(sBdf);
    GMM_LIB_ASSERT(pNode);
    if (!pNode)
    {
        UnLockMAContextSyncMutex();
        return GMM_ERROR;
    }

    if (pNode->pGmmLibContext)
    {
        int32_t ContextRefCount = pNode->pGmmLibContext->DecrementRefCount();
        // Refount = 0, It means that it the last client on this adapter
        // Lets free the LibContext and the Adapter Node
        if (!ContextRefCount)
        {
            pNode->pGmmLibContext->DestroyContext();
            // Delete/free the LibContext object
            delete pNode->pGmmLibContext;

            // Delete/free the AdapterNode from the Linked List
            RemoveAdapterNode(pNode);
            pNode = NULL;
        }
    }
    else
    {
        // No context exists for this node. Just remove it.
        RemoveAdapterNode(pNode);
        pNode = NULL;
    }

    UnLockMAContextSyncMutex();

    return GMM_SUCCESS;
}